

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O1

Dim * __thiscall
cnn::L1Distance::dim_forward
          (Dim *__return_storage_ptr__,L1Distance *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  invalid_argument *this_00;
  uint uVar5;
  ulong __n;
  bool bVar6;
  Dim r_1;
  Dim r;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined4 local_1a8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined4 local_178;
  
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar1 != 0x48) {
    __assert_fail("xs.size() == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/nodes-common.cc"
                  ,0x367,"virtual Dim cnn::L1Distance::dim_forward(const vector<Dim> &) const");
  }
  local_198 = *(undefined8 *)pDVar1->d;
  uStack_190 = *(undefined8 *)(pDVar1->d + 2);
  local_188 = *(undefined8 *)(pDVar1->d + 4);
  uVar2 = *(undefined8 *)(pDVar1->d + 6);
  local_178 = 1;
  local_1c8 = *(undefined8 *)pDVar1[1].d;
  uStack_1c0 = *(undefined8 *)(pDVar1[1].d + 2);
  local_1b8 = *(undefined8 *)(pDVar1[1].d + 4);
  uVar3 = *(undefined8 *)(pDVar1[1].d + 6);
  local_1a8 = 1;
  uStack_180._4_4_ = (uint)((ulong)uVar2 >> 0x20);
  __n = (ulong)uStack_180._4_4_;
  uStack_1b0._4_4_ = (uint)((ulong)uVar3 >> 0x20);
  bVar6 = uStack_180._4_4_ == uStack_1b0._4_4_;
  uStack_1b0 = uVar3;
  uStack_180 = uVar2;
  if (bVar6) {
    iVar4 = bcmp(&local_198,&local_1c8,__n);
    if (iVar4 == 0) {
      uVar5 = pDVar1[1].bd;
      if (pDVar1[1].bd < pDVar1->bd) {
        uVar5 = pDVar1->bd;
      }
      __return_storage_ptr__->bd = uVar5;
      __return_storage_ptr__->nd = 1;
      __return_storage_ptr__->d[0] = 1;
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,"Mismatched input dimensions in L1Distance: ",0x2b);
  operator<<((ostream *)&local_198,xs);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,(string *)&local_1c8);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

string LogisticSigmoid::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  s << "\\sigma(" << arg_names[0] << ')';
  return s.str();
}